

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O0

void __thiscall
cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)>::
cmCommandLineArgument<cmake::SetArgs(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__4&>
          (cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)> *this,string *n,
          string *failedMsg,Values t,RequiresSeparator s,anon_class_8_1_37d103f9 *func)

{
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  anon_class_8_1_37d103f9 *local_30;
  anon_class_8_1_37d103f9 *func_local;
  RequiresSeparator s_local;
  Values t_local;
  string *failedMsg_local;
  string *n_local;
  cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
  *this_local;
  
  local_30 = func;
  func_local._0_4_ = s;
  func_local._4_4_ = t;
  _s_local = failedMsg;
  failedMsg_local = n;
  n_local = (string *)this;
  cmAlphaNum::cmAlphaNum(&local_60," is invalid syntax for ");
  cmAlphaNum::cmAlphaNum(&local_90,n);
  cmStrCat<>((string *)this,&local_60,&local_90);
  std::__cxx11::string::string((string *)(this + 0x20),(string *)failedMsg);
  std::__cxx11::string::string((string *)(this + 0x40),(string *)n);
  *(Values *)(this + 0x60) = func_local._4_4_;
  *(RequiresSeparator *)(this + 100) = (RequiresSeparator)func_local;
  std::function<bool(std::__cxx11::string_const&,cmake*)>::
  function<cmake::SetArgs(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__4&,void>
            ((function<bool(std::__cxx11::string_const&,cmake*)> *)(this + 0x68),local_30);
  return;
}

Assistant:

cmCommandLineArgument(std::string n, std::string failedMsg, Values t,
                        RequiresSeparator s, FunctionType&& func)
    : InvalidSyntaxMessage(cmStrCat(" is invalid syntax for ", n))
    , InvalidValueMessage(std::move(failedMsg))
    , Name(std::move(n))
    , Type(t)
    , SeparatorNeeded(s)
    , StoreCall(std::forward<FunctionType>(func))
  {
  }